

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

text_fit ON_DimStyle::TextFitFromUnsigned(uint text_fit_as_unsigned)

{
  text_fit local_9;
  uint text_fit_as_unsigned_local;
  
  switch(text_fit_as_unsigned) {
  case 0:
    local_9 = Auto;
    break;
  case 1:
    local_9 = TextInside;
    break;
  case 2:
    local_9 = TextRight;
    break;
  case 3:
    local_9 = TextLeft;
    break;
  case 4:
    local_9 = TextHintRight;
    break;
  case 5:
    local_9 = TextHintLeft;
    break;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_dimensionstyle.cpp"
               ,0x208,"","invalid text_fit_as_unsigned parameter.");
    local_9 = Auto;
  }
  return local_9;
}

Assistant:

ON_DimStyle::text_fit ON_DimStyle::TextFitFromUnsigned(
  unsigned int text_fit_as_unsigned
)
{
  switch (text_fit_as_unsigned)
  {
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::text_fit::Auto);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::text_fit::TextInside);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::text_fit::TextRight);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::text_fit::TextLeft);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::text_fit::TextHintRight);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::text_fit::TextHintLeft);
  }
  ON_ERROR("invalid text_fit_as_unsigned parameter.");
  return (ON_DimStyle::text_fit::Auto);
}